

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_advanced.hpp
# Opt level: O0

void LDPC4QKD::
     encode_with<3ul,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               (size_t code_id,vector<unsigned_char,_std::allocator<unsigned_char>_> *key,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *result)

{
  __tuple_element_t<3UL,_tuple<FixedSizeEncoderQC<unsigned_char,_64UL,_192UL,_32UL,_800UL,_unsigned_short,_unsigned_char,_unsigned_char>,_FixedSizeEncoderQC<unsigned_char,_128UL,_384UL,_64UL,_1600UL,_unsigned_short,_unsigned_char,_unsigned_char>,_FixedSizeEncoderQC<unsigned_char,_1024UL,_3072UL,_512UL,_12800UL,_unsigned_short,_unsigned_short,_unsigned_short>,_FixedSizeEncoderQC<unsigned_char,_64UL,_128UL,_32UL,_480UL,_unsigned_short,_unsigned_char,_unsigned_char>,_FixedSizeEncoderQC<unsigned_char,_128UL,_256UL,_64UL,_960UL,_unsigned_short,_unsigned_char,_unsigned_char>,_FixedSizeEncoderQC<unsigned_char,_1024UL,_2048UL,_512UL,_7680UL,_unsigned_short,_unsigned_short,_unsigned_short>_>_>
  *this;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *result_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *key_local;
  size_t code_id_local;
  
  if (code_id == 3) {
    this = std::
           get<3ul,LDPC4QKD::FixedSizeEncoderQC<unsigned_char,64ul,192ul,32ul,800ul,unsigned_short,unsigned_char,unsigned_char>,LDPC4QKD::FixedSizeEncoderQC<unsigned_char,128ul,384ul,64ul,1600ul,unsigned_short,unsigned_char,unsigned_char>,LDPC4QKD::FixedSizeEncoderQC<unsigned_char,1024ul,3072ul,512ul,12800ul,unsigned_short,unsigned_short,unsigned_short>,LDPC4QKD::FixedSizeEncoderQC<unsigned_char,64ul,128ul,32ul,480ul,unsigned_short,unsigned_char,unsigned_char>,LDPC4QKD::FixedSizeEncoderQC<unsigned_char,128ul,256ul,64ul,960ul,unsigned_short,unsigned_char,unsigned_char>,LDPC4QKD::FixedSizeEncoderQC<unsigned_char,1024ul,2048ul,512ul,7680ul,unsigned_short,unsigned_short,unsigned_short>>
                     ((tuple<LDPC4QKD::FixedSizeEncoderQC<unsigned_char,_64UL,_192UL,_32UL,_800UL,_unsigned_short,_unsigned_char,_unsigned_char>,_LDPC4QKD::FixedSizeEncoderQC<unsigned_char,_128UL,_384UL,_64UL,_1600UL,_unsigned_short,_unsigned_char,_unsigned_char>,_LDPC4QKD::FixedSizeEncoderQC<unsigned_char,_1024UL,_3072UL,_512UL,_12800UL,_unsigned_short,_unsigned_short,_unsigned_short>,_LDPC4QKD::FixedSizeEncoderQC<unsigned_char,_64UL,_128UL,_32UL,_480UL,_unsigned_short,_unsigned_char,_unsigned_char>,_LDPC4QKD::FixedSizeEncoderQC<unsigned_char,_128UL,_256UL,_64UL,_960UL,_unsigned_short,_unsigned_char,_unsigned_char>,_LDPC4QKD::FixedSizeEncoderQC<unsigned_char,_1024UL,_2048UL,_512UL,_7680UL,_unsigned_short,_unsigned_short,_unsigned_short>_>
                       *)all_encoders_tuple);
    FixedSizeEncoderQC<unsigned_char,64ul,128ul,32ul,480ul,unsigned_short,unsigned_char,unsigned_char>
    ::
    encode_qc<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((FixedSizeEncoderQC<unsigned_char,64ul,128ul,32ul,480ul,unsigned_short,unsigned_char,unsigned_char>
                *)this,key,result);
  }
  else {
    encode_with<4ul,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (code_id,key,result);
  }
  return;
}

Assistant:

void encode_with(std::size_t code_id, auto const &key, auto &result) {
        if (N == code_id) {
            // if/when `all_encoders_tuple` contains non-QC matrices, this needs to change!
            // Originally, this was using `encode` instead of `encode_qc` but then it doesn't work with `vector<bool>`
            std::get<N>(all_encoders_tuple).encode_qc(key, result);
            return;
        }

        if constexpr (N + 1 < std::tuple_size_v<decltype(all_encoders_tuple)>) {
            return encode_with<N + 1>(code_id, key, result);
        }
    }